

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O1

FT_Error tt_get_var_blend(TT_Face face,FT_UInt *num_coords,FT_Fixed **coords,
                         FT_Fixed **normalizedcoords,FT_MM_Var **mm_var)

{
  GX_Blend pGVar1;
  FT_MM_Var *pFVar2;
  
  pGVar1 = face->blend;
  if (pGVar1 == (GX_Blend)0x0) {
    if (num_coords != (FT_UInt *)0x0) {
      *num_coords = 0;
    }
    if (coords != (FT_Fixed **)0x0) {
      *coords = (FT_Fixed *)0x0;
    }
    if (mm_var == (FT_MM_Var **)0x0) {
      return 0;
    }
    pFVar2 = (FT_MM_Var *)0x0;
  }
  else {
    if (num_coords != (FT_UInt *)0x0) {
      *num_coords = pGVar1->num_axis;
    }
    if (coords != (FT_Fixed **)0x0) {
      *coords = pGVar1->coords;
    }
    if (normalizedcoords != (FT_Fixed **)0x0) {
      *normalizedcoords = face->blend->normalizedcoords;
    }
    if (mm_var == (FT_MM_Var **)0x0) {
      return 0;
    }
    pFVar2 = face->blend->mmvar;
  }
  *mm_var = pFVar2;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_get_var_blend( TT_Face      face,
                    FT_UInt     *num_coords,
                    FT_Fixed*   *coords,
                    FT_Fixed*   *normalizedcoords,
                    FT_MM_Var*  *mm_var )
  {
    if ( face->blend )
    {
      if ( num_coords )
        *num_coords       = face->blend->num_axis;
      if ( coords )
        *coords           = face->blend->coords;
      if ( normalizedcoords )
        *normalizedcoords = face->blend->normalizedcoords;
      if ( mm_var )
        *mm_var           = face->blend->mmvar;
    }
    else
    {
      if ( num_coords )
        *num_coords = 0;
      if ( coords )
        *coords     = NULL;
      if ( mm_var )
        *mm_var     = NULL;
    }

    return FT_Err_Ok;
  }